

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

void player_kill_monster(monster_conflict *mon,player *p,char *note)

{
  uint32_t *puVar1;
  monster_base *pmVar2;
  player *ppVar3;
  _Bool _Var4;
  int iVar5;
  uint32_t uVar6;
  size_t sVar7;
  long lVar8;
  short sVar9;
  long lVar10;
  long lVar11;
  wchar_t wVar12;
  int iVar13;
  int iVar14;
  char *fmt;
  monster_base **ppmVar15;
  uint type;
  char m_name [80];
  char buf [80];
  char unique_name [80];
  monster_lore *local_4e8;
  char local_4d8 [80];
  char local_488 [80];
  char local_438 [1032];
  
  local_4e8 = get_lore(mon->race);
  wVar12 = (uint)(note != (char *)0x0) << 9;
  monster_desc(local_4d8,0x50,(monster *)mon,wVar12);
  if (mon->original_race != (monster_race *)0x0) {
    monster_revert_shape(mon);
    local_4e8 = get_lore(mon->race);
    monster_desc(local_4d8,0x50,(monster *)mon,wVar12);
  }
  _Var4 = monster_is_unique((monster *)mon);
  type = 6;
  if (_Var4) {
    pmVar2 = mon->race->base;
    ppmVar15 = &rb_info;
    do {
      ppmVar15 = &((monster_base *)ppmVar15)->next->next;
      if ((monster_base *)ppmVar15 == (monster_base *)0x0) break;
      iVar5 = strcmp("Morgoth",((monster_base *)ppmVar15)->name);
    } while (iVar5 != 0);
    type = (pmVar2 == (monster_base *)ppmVar15) + 0x97;
  }
  _Var4 = flag_has_dbg((player->state).pflags,10,0x45,"player->state.pflags","(PF_SOUL_SIPHON)");
  if ((((_Var4) && (player->csp < player->msp)) &&
      (_Var4 = monster_is_living((monster *)mon), _Var4)) &&
     ((_Var4 = monster_is_stupid((monster *)mon), !_Var4 &&
      (_Var4 = flag_has_dbg(mon->race->flags,0xc,0x46,"mon->race->flags","RF_DEMON"), !_Var4)))) {
    sVar9 = (short)((uint)(mon->maxhp * 0x100008889) >> 0x10);
    iVar13 = (int)(short)(((sVar9 >> 4) - (sVar9 >> 0xf)) + 2);
    msg("You gain mana.");
    iVar5 = player->csp + iVar13;
    sVar9 = player->msp;
    iVar14 = (int)sVar9;
    if ((int)player->lev < iVar5 - iVar14) {
      msg("You absorb too much mana!");
      ppVar3 = player;
      wVar12 = damroll(2,8);
      take_hit(ppVar3,wVar12,"mana burn");
      sVar9 = player->msp;
      iVar5 = player->csp + iVar13;
      iVar14 = (int)sVar9;
    }
    ppVar3 = player;
    if (iVar5 <= iVar14) {
      sVar9 = (short)iVar5;
    }
    player->csp = sVar9;
    puVar1 = &ppVar3->upkeep->redraw;
    *puVar1 = *puVar1 | 0x80;
  }
  if (note == (char *)0x0) {
    notice_stuff(p);
    _Var4 = monster_is_visible((monster *)mon);
    if (_Var4) {
      _Var4 = monster_is_destroyed((monster *)mon);
      if (_Var4) {
        fmt = "You have destroyed %s.";
      }
      else {
        fmt = "You have slain %s.";
      }
    }
    else {
      fmt = "You have killed %s.";
    }
    msgt(type,fmt,local_4d8);
  }
  else {
    sVar7 = strlen(note);
    if (1 < sVar7) {
      notice_stuff(p);
      my_strcap(local_4d8);
      msgt(type,"%s%s",local_4d8,note);
    }
  }
  lVar10 = (long)p->lev;
  lVar8 = (long)mon->race->level * (long)mon->race->mexp;
  lVar11 = (ulong)p->exp_frac + (lVar8 % lVar10 << 0x10) / lVar10;
  p->exp_frac = (uint16_t)lVar11;
  _Var4 = monster_is_unique((monster *)mon);
  if (_Var4) {
    if (mon->original_race != (monster_race *)0x0) {
      __assert_fail("mon->original_race == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                    ,0x478,
                    "void player_kill_monster(struct monster *, struct player *, const char *)");
    }
    mon->race->max_num = '\0';
    monster_desc(local_438,0x50,(monster *)mon,L'\x88');
    strnfmt(local_488,0x50,"Killed %s",local_438);
    history_add(p,local_488,L'\x06');
  }
  _Var4 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
  if ((_Var4) && (uVar6 = Rand_div(3), uVar6 != 0)) {
    strnfmt(local_438,0x400,"%s/bone.%03d");
    _Var4 = file_exists(local_438);
    if (_Var4) {
      file_delete(local_438);
    }
  }
  player_exp_gain(p,(uint)(0xffff < (int)lVar11) + (int)(lVar8 / lVar10));
  monster_death(mon,p,false);
  if (p->timed[0x31] != 0) {
    player_inc_timed(p,L'1',L'\n',false,false,true);
    player_over_exert(p,L'\x10',L'\x05',L'\x03');
    player_over_exert(p,L' ',L'\x05',L'\n');
  }
  _Var4 = monster_is_visible((monster *)mon);
  if ((_Var4) || (_Var4 = monster_is_unique((monster *)mon), _Var4)) {
    if (local_4e8->pkills < 0x7fff) {
      local_4e8->pkills = local_4e8->pkills + 1;
    }
    if (local_4e8->tkills < 0x7fff) {
      local_4e8->tkills = local_4e8->tkills + 1;
    }
    lore_update(mon->race,local_4e8);
    monster_race_track(p->upkeep,mon->race);
  }
  delete_monster_idx((chunk *)cave,mon->midx);
  return;
}

Assistant:

static void player_kill_monster(struct monster *mon, struct player *p,
		const char *note)
{
	int32_t div, new_exp, new_exp_frac;
	struct monster_lore *lore = get_lore(mon->race);
	char m_name[80];
	char buf[80];
	int desc_mode = MDESC_DEFAULT | ((note) ? MDESC_COMMA : 0);

	/* Assume normal death sound */
	int soundfx = MSG_KILL;

	/* Extract monster name */
	monster_desc(m_name, sizeof(m_name), mon, desc_mode);

	/* Shapechanged monsters revert on death */
	if (mon->original_race) {
		monster_revert_shape(mon);
		lore = get_lore(mon->race);
		monster_desc(m_name, sizeof(m_name), mon, desc_mode);
	}

	/* Play a special sound if the monster was unique */
	if (monster_is_unique(mon)) {
		if (mon->race->base == lookup_monster_base("Morgoth"))
			soundfx = MSG_KILL_KING;
		else
			soundfx = MSG_KILL_UNIQUE;
	}

	/* Specialty ability Soul Siphon */
	if (player_has(player, PF_SOUL_SIPHON) && (player->csp < player->msp) &&
		monster_is_living(mon) && !monster_is_stupid(mon) &&
		!rf_has(mon->race->flags, RF_DEMON)) {
		int gain = 2 + (mon->maxhp / 30);
		msg("You gain mana.");

		/* If there is a lot of excess mana, it can do damage */
		if (player->csp + gain - player->msp > player->lev) {
			msg("You absorb too much mana!");
			take_hit(player, damroll(2, 8), "mana burn");
		}
		player->csp = MIN(player->csp + gain, player->msp);
		player->upkeep->redraw |= PR_MANA;
	}

	/* Death message */
	if (note) {
		if (strlen(note) <= 1) {
			/* Death by Spell attack - messages handled by project_m() */
		} else {
			/* Make sure to flush any monster messages first */
			notice_stuff(p);

			/* Death by Missile attack */
			my_strcap(m_name);
			msgt(soundfx, "%s%s", m_name, note);
		}
	} else {
		/* Make sure to flush any monster messages first */
		notice_stuff(p);

		if (!monster_is_visible(mon))
			/* Death by physical attack -- invisible monster */
			msgt(soundfx, "You have killed %s.", m_name);
		else if (monster_is_destroyed(mon))
			/* Death by Physical attack -- non-living monster */
			msgt(soundfx, "You have destroyed %s.", m_name);
		else
			/* Death by Physical attack -- living monster */
			msgt(soundfx, "You have slain %s.", m_name);
	}

	/* Player level */
	div = p->lev;

	/* Give some experience for the kill */
	new_exp = ((long)mon->race->mexp * mon->race->level) / div;

	/* Handle fractional experience */
	new_exp_frac = ((((long)mon->race->mexp * mon->race->level) % div)
					* 0x10000L / div) + p->exp_frac;

	/* Keep track of experience */
	if (new_exp_frac >= 0x10000L) {
		new_exp++;
		p->exp_frac = (uint16_t)(new_exp_frac - 0x10000L);
	} else {
		p->exp_frac = (uint16_t)new_exp_frac;
	}

	/* When the player kills a Unique, it stays dead */
	if (monster_is_unique(mon)) {
		char unique_name[80];
		assert(mon->original_race == NULL);
		mon->race->max_num = 0;

		/* This gets the correct name if we slay an invisible
		 * unique and don't have See Invisible. */
		monster_desc(unique_name, sizeof(unique_name), mon,
					 MDESC_DIED_FROM);

		/* Log the slaying of a unique */
		strnfmt(buf, sizeof(buf), "Killed %s", unique_name);
		history_add(p, buf, HIST_SLAY_UNIQUE);
	}

	/* When the player kills a player ghost, the bones file that it used
	 * is (often) deleted. */
	if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		if (!one_in_(3)) {
			char path[1024];
			strnfmt(path, sizeof(path), "%s/bone.%03d", ANGBAND_DIR_BONE,
					cave->ghost->bones_selector);
			if (file_exists(path)) file_delete(path);
		}
	}

	/* Gain experience */
	player_exp_gain(p, new_exp);

	/* Generate treasure */
	monster_death(mon, p, false);

	/* Bloodlust bonus */
	if (p->timed[TMD_BLOODLUST]) {
		player_inc_timed(p, TMD_BLOODLUST, 10, false, false, true);
		player_over_exert(p, PY_EXERT_CONF, 5, 3);
		player_over_exert(p, PY_EXERT_HALLU, 5, 10);
	}

	/* Recall even invisible uniques or winners */
	if (monster_is_visible(mon) || monster_is_unique(mon)) {
		/* Count kills this life */
		if (lore->pkills < SHRT_MAX) lore->pkills++;

		/* Count kills in all lives */
		if (lore->tkills < SHRT_MAX) lore->tkills++;

		/* Update lore and tracking */
		lore_update(mon->race, lore);
		monster_race_track(p->upkeep, mon->race);
	}

	/* Delete the monster */
	delete_monster_idx(cave, mon->midx);
}